

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divceil.hpp
# Opt level: O1

enable_if_t<std::is_unsigned<unsigned_long>::value,_unsigned_long>
burst::divceil<unsigned_long,unsigned_long>(Integer<unsigned_long> n,Integer<unsigned_long> divisor)

{
  enable_if_t<std::is_unsigned<unsigned_long>::value,_unsigned_long> eVar1;
  domain_error *this;
  
  if (divisor != 0) {
    if (n == 0) {
      eVar1 = 0;
    }
    else {
      eVar1 = (n - 1) / divisor + 1;
    }
    return eVar1;
  }
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this,anon_var_dwarf_1eff9);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

constexpr auto divceil (Integer<I> n, Integer<J> divisor)
    {
        if (divisor > 0)
        {
            return detail::divceil_impl(n, divisor);
        }
        else
        {
            throw std::domain_error("Целая часть от деления на неположительное число не определена.");
        }
    }